

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

bool despot::option::PrintUsageImplementation::isWideChar(uint ch)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  if (ch == 0x303f) {
    return false;
  }
  auVar2._0_4_ = -(uint)(-0x7fffd405 < (int)(ch - 0xac00 ^ 0x80000000));
  auVar2._4_4_ = -(uint)(-0x7ffffe01 < (int)(ch - 0xf900 ^ 0x80000000));
  auVar2._8_4_ = -(uint)(-0x7fffffa5 < (int)(ch - 0xfe10 ^ 0x80000000));
  auVar2._12_4_ = -(uint)(-0x7fffffa1 < (int)(ch - 0xff01 ^ 0x80000000));
  auVar1._0_4_ = -(uint)(-0x7fffffa1 < (int)(ch - 0x1100 ^ 0x80000000));
  auVar1._4_4_ = -(uint)(-0x7fffffff < (int)(ch - 0x2329 ^ 0x80000000));
  auVar1._8_4_ = -(uint)(-0x7fff89ba < (int)(ch - 0x2e80 ^ 0x80000000));
  auVar1._12_4_ = -(uint)(-0x7fffffe4 < (int)(ch - 0xa960 ^ 0x80000000));
  auVar2 = packssdw(auVar1,auVar2);
  auVar2 = packsswb(auVar2,auVar2);
  return (0x1afff < ch || ch - 0xffe0 < 7) ||
         (byte)(SUB161(auVar2 >> 7,0) & 1 | (SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar2 >> 0x17,0) & 1) << 2 | (SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar2 >> 0x27,0) & 1) << 4 | (SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar2 >> 0x37,0) & 1) << 6 | SUB161(auVar2 >> 0x3f,0) << 7) != 0xff;
}

Assistant:

static bool isWideChar(unsigned ch) {
		if (ch == 0x303F)
			return false;

		return ((0x1100 <= ch && ch <= 0x115F) || (0x2329 <= ch && ch <= 0x232A)
			|| (0x2E80 <= ch && ch <= 0xA4C6) || (0xA960 <= ch && ch <= 0xA97C)
			|| (0xAC00 <= ch && ch <= 0xD7FB) || (0xF900 <= ch && ch <= 0xFAFF)
			|| (0xFE10 <= ch && ch <= 0xFE6B) || (0xFF01 <= ch && ch <= 0xFF60)
			|| (0xFFE0 <= ch && ch <= 0xFFE6) || (0x1B000 <= ch));
	}